

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_transaction.cpp
# Opt level: O3

void __thiscall cpp_db::sqlite_transaction::execute(sqlite_transaction *this,char *sql)

{
  int iVar1;
  sqlite3 *psVar2;
  size_t sVar3;
  sqlite_exception *psVar4;
  unique_ptr<sqlite3_stmt,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JohannAnhofer[P]cpp_db_sqlite_sqlite_transaction_cpp:43:20)>
  pstmt;
  sqlite3_stmt *stmt;
  char *tail;
  unique_ptr<sqlite3_stmt,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JohannAnhofer[P]cpp_db_sqlite_sqlite_transaction_cpp:43:20)>
  local_48;
  _Head_base<0UL,_sqlite3_stmt_*,_false> local_40;
  undefined8 local_38;
  
  local_38 = 0;
  local_40._M_head_impl = (sqlite3_stmt *)0x0;
  psVar2 = get_db_handle(this);
  sVar3 = strlen(sql);
  iVar1 = sqlite3_prepare(psVar2,sql,sVar3 & 0xffffffff,&local_40,&local_38);
  if ((iVar1 != 0) && (iVar1 != 0x65)) {
    psVar4 = (sqlite_exception *)__cxa_allocate_exception(0x18);
    psVar2 = get_db_handle(this);
    sqlite_exception::sqlite_exception(psVar4,iVar1,psVar2);
    __cxa_throw(psVar4,&sqlite_exception::typeinfo,std::runtime_error::~runtime_error);
  }
  local_48._M_t.
  super___uniq_ptr_impl<sqlite3_stmt,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JohannAnhofer[P]cpp_db_sqlite_sqlite_transaction_cpp:43:20)>
  ._M_t.
  super__Tuple_impl<0UL,_sqlite3_stmt_*,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JohannAnhofer[P]cpp_db_sqlite_sqlite_transaction_cpp:43:20)>
  .super__Head_base<0UL,_sqlite3_stmt_*,_false>._M_head_impl =
       (__uniq_ptr_data<sqlite3_stmt,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JohannAnhofer[P]cpp_db_sqlite_sqlite_transaction_cpp:43:20),_true,_true>
        )(__uniq_ptr_data<sqlite3_stmt,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JohannAnhofer[P]cpp_db_sqlite_sqlite_transaction_cpp:43:20),_true,_true>
          )local_40._M_head_impl;
  iVar1 = sqlite3_step();
  if ((iVar1 != 0) && (iVar1 != 0x65)) {
    psVar4 = (sqlite_exception *)__cxa_allocate_exception(0x18);
    psVar2 = get_db_handle(this);
    sqlite_exception::sqlite_exception(psVar4,iVar1,psVar2);
    __cxa_throw(psVar4,&sqlite_exception::typeinfo,std::runtime_error::~runtime_error);
  }
  std::
  unique_ptr<sqlite3_stmt,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/sqlite/sqlite_transaction.cpp:43:20)>
  ::~unique_ptr(&local_48);
  return;
}

Assistant:

void sqlite_transaction::execute(const char *sql)
{
    const char *tail = nullptr;
    sqlite3_stmt *stmt = nullptr;
	int status = sqlite3_prepare(get_db_handle(), sql, static_cast<int>(strlen(sql)), &stmt, &tail);
    if (status != SQLITE_OK && status != SQLITE_DONE)
        throw sqlite_exception(status, get_db_handle());
    auto deleter = [](sqlite3_stmt*s){sqlite3_finalize(s); };
    std::unique_ptr<sqlite3_stmt, decltype(deleter)> pstmt(stmt, deleter);
    status = sqlite3_step(stmt);
    if (status != SQLITE_OK && status != SQLITE_DONE)
        throw sqlite_exception(status, get_db_handle());
}